

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unfounded_check.cpp
# Opt level: O2

bool __thiscall
Clasp::DefaultUnfoundedCheck::assertAtom(DefaultUnfoundedCheck *this,Literal a,UfsType t)

{
  ReasonStrategy RVar1;
  pointer pLVar2;
  bool bVar3;
  pointer puVar4;
  Solver *s;
  byte bVar5;
  Result RVar6;
  Antecedent local_38;
  Literal local_2c;
  
  s = this->solver_;
  puVar4 = (s->assign_).assign_.ebo_.buf;
  bVar5 = 2 - ((a.rep_ & 2) == 0);
  if ((((*(byte *)((long)puVar4 + (ulong)(a.rep_ & 0xfffffffc)) & 3) == bVar5) ||
      (this->strategy_ == distinct_reason)) || ((this->activeClause_).ebo_.size == 0)) {
    if ((this->loopAtoms_).ebo_.size != 0) {
      createLoopFormula(this);
    }
    local_38.data_ = CONCAT44(local_38.data_._4_4_,a.rep_) & 0xfffffffffffffffe ^ 2;
    bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::assign
              (&this->activeClause_,1,(Literal *)&local_38);
    computeReason(this,t);
    s = this->solver_;
    puVar4 = (s->assign_).assign_.ebo_.buf;
  }
  local_2c.rep_ = a.rep_ & 0xfffffffe ^ 2;
  ((this->activeClause_).ebo_.buf)->rep_ = local_2c.rep_;
  if ((((((byte)puVar4[a.rep_ >> 2] & 3) == bVar5) ||
       (RVar1 = this->strategy_, RVar1 == only_reason)) || (RVar1 == no_reason)) ||
     (((RVar1 == shared_reason && (3 < (this->activeClause_).ebo_.size)) &&
      ((this->info_).super_ConstraintScore.rep < 0x40000000)))) {
    local_38.data_ = (uint64)this;
    bVar3 = Solver::force(s,&local_2c,&local_38);
    if (bVar3) {
      bVar3 = true;
      if (this->strategy_ != no_reason) {
        if (this->strategy_ == only_reason) {
          pLVar2 = (this->activeClause_).ebo_.buf;
          bk_lib::pod_vector<Clasp::Literal,std::allocator<Clasp::Literal>>::assign<Clasp::Literal*>
                    ((pod_vector<Clasp::Literal,std::allocator<Clasp::Literal>> *)
                     (this->reasons_ + ((a.rep_ >> 2) - 1)),pLVar2 + 1,
                     pLVar2 + (this->activeClause_).ebo_.size);
        }
        else {
          local_38.data_ = CONCAT44(local_38.data_._4_4_,a.rep_) & 0xfffffffffffffffe ^ 2;
          bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
                    (&this->loopAtoms_,(Literal *)&local_38);
        }
      }
    }
    else {
      bVar3 = false;
    }
  }
  else {
    RVar6 = ClauseCreator::create(s,&this->activeClause_,0x80,&this->info_);
    bVar3 = ((undefined1  [16])RVar6 & (undefined1  [16])0x2) == (undefined1  [16])0x0;
  }
  return bVar3;
}

Assistant:

bool DefaultUnfoundedCheck::assertAtom(Literal a, UfsType t) {
	if (solver_->isTrue(a) || strategy_ == distinct_reason || activeClause_.empty()) {
		// Conflict, first atom of unfounded set, or distinct reason for each atom requested -
		// compute reason for a being unfounded.
		// We must flush any not yet created loop formula here - the
		// atoms in loopAtoms_ depend on the current reason which is about to be replaced.
		if (!loopAtoms_.empty()) {
			createLoopFormula();
		}
		activeClause_.assign(1, ~a);
		computeReason(t);
	}
	activeClause_[0] = ~a;
	bool tainted = info_.tagged() || info_.aux();
	bool noClause = solver_->isTrue(a) || strategy_ == no_reason || strategy_ == only_reason || (strategy_ == shared_reason && activeClause_.size() > 3 && !tainted);
	if (noClause) {
		if (!solver_->force(~a, this))  { return false; }
		if (strategy_ == only_reason)   { reasons_[a.var()-1].assign(activeClause_.begin()+1, activeClause_.end()); }
		else if (strategy_ != no_reason){ loopAtoms_.push_back(~a); }
		return true;
	}
	else { // learn nogood and assert ~a
		return ClauseCreator::create(*solver_, activeClause_, ClauseCreator::clause_no_prepare, info_).ok();
	}
}